

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
anon_unknown.dwarf_147e942::ScriptMaker::ToPKBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ScriptMaker *this,uint32_t key)

{
  pointer pCVar1;
  byte bVar2;
  allocator_type *__a;
  long lVar3;
  uchar *puVar4;
  pointer pCVar5;
  long in_FS_OFFSET;
  XOnlyPubKey xonly_pubkey;
  allocator_type local_39;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_script_ctx == P2WSH) {
    pCVar1 = (this->m_keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pCVar5 = pCVar1 + key;
    bVar2 = pCVar1[key].vch[0];
    lVar3 = 0x21;
    if ((bVar2 & 0xfe) != 2) {
      bVar2 = bVar2 - 4;
      if (bVar2 < 4) {
        lVar3 = (&DAT_004b0788)[bVar2];
      }
      else {
        lVar3 = 0;
      }
    }
    puVar4 = pCVar5->vch + lVar3;
    __a = (allocator_type *)&stack0xffffffffffffffc8;
  }
  else {
    if (this->m_script_ctx != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    pCVar5 = (this->m_keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = pCVar5[key].vch + 1;
    local_38 = *(undefined8 *)puVar4;
    uStack_30 = *(undefined8 *)(puVar4 + 8);
    puVar4 = pCVar5[key].vch + 0x11;
    local_28 = *(undefined8 *)puVar4;
    uStack_20 = *(undefined8 *)(puVar4 + 8);
    puVar4 = &stack0xffffffffffffffe8;
    pCVar5 = (pointer)&stack0xffffffffffffffc8;
    __a = &local_39;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             pCVar5->vch,puVar4,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(uint32_t key) const {
        // In Tapscript keys always serialize as x-only, whether an x-only key was used in the descriptor or not.
        if (!miniscript::IsTapscript(m_script_ctx)) {
            return {m_keys[key].begin(), m_keys[key].end()};
        }
        const XOnlyPubKey xonly_pubkey{m_keys[key]};
        return {xonly_pubkey.begin(), xonly_pubkey.end()};
    }